

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O1

int idaLsATimes(void *ida_mem,N_Vector v,N_Vector z)

{
  int iVar1;
  IDALsMem idals_mem;
  IDAMem IDA_mem;
  IDALsMem local_28;
  IDAMem local_20;
  
  iVar1 = idaLs_AccessLMem(ida_mem,"idaLsATimes",&local_20,&local_28);
  if (iVar1 == 0) {
    iVar1 = (*local_28->jtimes)(local_20->ida_tn,local_28->ycur,local_28->ypcur,local_28->rcur,v,z,
                                local_20->ida_cj,local_28->jt_data,local_28->ytemp,local_28->yptemp)
    ;
    local_28->njtimes = local_28->njtimes + 1;
  }
  return iVar1;
}

Assistant:

int idaLsATimes(void* ida_mem, N_Vector v, N_Vector z)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  int retval;

  /* access IDALsMem structure */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }

  /* call Jacobian-times-vector product routine
     (either user-supplied or internal DQ) */
  retval = idals_mem->jtimes(IDA_mem->ida_tn, idals_mem->ycur, idals_mem->ypcur,
                             idals_mem->rcur, v, z, IDA_mem->ida_cj,
                             idals_mem->jt_data, idals_mem->ytemp,
                             idals_mem->yptemp);
  idals_mem->njtimes++;
  return (retval);
}